

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O2

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateRandomBernoulliStaticLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  bool bVar1;
  RandomBernoulliStaticLayerParams *pRVar2;
  string err;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  Result r;
  
  Result::Result(&r);
  validateInputCount((Result *)&err,layer,0,0);
  Result::operator=(&r,(Result *)&err);
  std::__cxx11::string::~string((string *)&err._M_string_length);
  bVar1 = Result::good(&r);
  if (bVar1) {
    validateOutputCount((Result *)&err,layer,1,1);
    Result::operator=(&r,(Result *)&err);
    std::__cxx11::string::~string((string *)&err._M_string_length);
  }
  pRVar2 = Specification::NeuralNetworkLayer::randombernoullistatic(layer);
  if ((pRVar2->outputshape_).current_size_ == 0) {
    std::operator+(&local_60,"Target shape is required parameter for \'",(layer->name_).ptr_);
    std::operator+(&err,&local_60,"\' layer.");
    std::__cxx11::string::~string((string *)&local_60);
    Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&err);
  }
  else {
    if ((0.0 <= pRVar2->prob_) && (pRVar2->prob_ <= 1.0)) {
      Result::Result(__return_storage_ptr__,&r);
      goto LAB_00256b8b;
    }
    std::operator+(&local_60,"Value of prob should be in range [0: 1] for \'",(layer->name_).ptr_);
    std::operator+(&err,&local_60,"\' layer.");
    std::__cxx11::string::~string((string *)&local_60);
    Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&err);
  }
  std::__cxx11::string::~string((string *)&err);
LAB_00256b8b:
  std::__cxx11::string::~string((string *)&r.m_message);
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateRandomBernoulliStaticLayer(const Specification::NeuralNetworkLayer& layer) {
    Result r;
    r = validateInputCount(layer, 0, 0);
    if (r.good()) {
        r = validateOutputCount(layer, 1, 1);
    }
    const auto& params = layer.randombernoullistatic();
    if (params.outputshape_size() == 0) {
        const std::string err = "Target shape is required parameter for '" + layer.name() + "' layer.";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }
    if (params.prob() < 0.0f || params.prob() > 1.0f) {
        const std::string err = "Value of prob should be in range [0: 1] for '" + layer.name() + "' layer.";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }
    return r;
}